

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnGlobalInitExpr_GlobalGet
          (SharedValidator *this,Location *loc,Var *ref_global_var)

{
  Result RVar1;
  Enum EVar2;
  bool bVar3;
  GlobalType ref_global;
  GlobalType local_80;
  Var local_78;
  
  local_80.type.enum_ = Any;
  local_80.mutable_ = true;
  Var::Var(&local_78,ref_global_var);
  RVar1 = CheckGlobalIndex(this,&local_78,&local_80);
  Var::~Var(&local_78);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if (ref_global_var->type_ != Index) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",
                    0x38,"Index wabt::Var::index() const");
    }
    bVar3 = false;
    if (this->num_imported_globals_ <= (ref_global_var->field_2).index_) {
      RVar1 = PrintError(this,&ref_global_var->loc,
                         "initializer expression can only reference an imported global");
      bVar3 = RVar1.enum_ == Error;
    }
    if (local_80.mutable_ == true) {
      RVar1 = PrintError(this,loc,"initializer expression cannot reference a mutable global");
      bVar3 = (bool)(RVar1.enum_ == Error | bVar3);
    }
    RVar1 = CheckType(this,loc,local_80.type,
                      (Type)(this->globals_).
                            super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].type.enum_,
                      "global initializer expression");
    EVar2 = (Enum)(byte)(RVar1.enum_ == Error | bVar3);
  }
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnGlobalInitExpr_GlobalGet(const Location& loc,
                                                   Var ref_global_var) {
  Result result = Result::Ok;
  GlobalType ref_global;
  CHECK_RESULT(CheckGlobalIndex(ref_global_var, &ref_global));

  if (ref_global_var.index() >= num_imported_globals_) {
    result |= PrintError(
        ref_global_var.loc,
        "initializer expression can only reference an imported global");
  }

  if (ref_global.mutable_) {
    result |= PrintError(
        loc, "initializer expression cannot reference a mutable global");
  }

  result |= CheckType(loc, ref_global.type, globals_.back().type,
                      "global initializer expression");
  return result;
}